

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::LoadedSourceEvent>::construct
          (BasicTypeInfo<dap::LoadedSourceEvent> *this,void *ptr)

{
  vector<dap::any,_std::allocator<dap::any>_> local_38;
  
  memset(ptr,0,0x150);
  *(long *)ptr = (long)ptr + 0x10;
  *(undefined4 *)((long)ptr + 0x10) = 0x77656e;
  *(undefined8 *)((long)ptr + 8) = 3;
  local_38.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  *(undefined8 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x28) = 0;
  any::operator=((any *)((long)ptr + 0x20),&local_38);
  std::vector<dap::any,_std::allocator<dap::any>_>::~vector(&local_38);
  *(undefined1 *)((long)ptr + 0x58) = 0;
  *(undefined8 *)((long)ptr + 0x60) = 0;
  *(undefined8 *)((long)ptr + 0x68) = 0;
  *(undefined8 *)((long)ptr + 0x69) = 0;
  *(undefined8 *)((long)ptr + 0x71) = 0;
  *(long *)((long)ptr + 0x80) = (long)ptr + 0x90;
  *(undefined8 *)((long)ptr + 0x88) = 0;
  *(undefined1 *)((long)ptr + 0x90) = 0;
  *(undefined1 *)((long)ptr + 0xa0) = 0;
  *(long *)((long)ptr + 0xa8) = (long)ptr + 0xb8;
  *(undefined8 *)((long)ptr + 0xb0) = 0;
  *(undefined1 *)((long)ptr + 0xb8) = 0;
  *(undefined1 *)((long)ptr + 200) = 0;
  *(long *)((long)ptr + 0xd0) = (long)ptr + 0xe0;
  *(undefined8 *)((long)ptr + 0xd8) = 0;
  *(undefined1 *)((long)ptr + 0xe0) = 0;
  *(undefined1 *)((long)ptr + 0xf0) = 0;
  *(long *)((long)ptr + 0xf8) = (long)ptr + 0x108;
  *(undefined8 *)((long)ptr + 0x100) = 0;
  *(undefined1 *)((long)ptr + 0x108) = 0;
  *(undefined1 *)((long)ptr + 0x118) = 0;
  *(undefined8 *)((long)ptr + 0x120) = 0;
  *(undefined1 *)((long)ptr + 0x128) = 0;
  *(undefined8 *)((long)ptr + 0x139) = 0;
  *(undefined8 *)((long)ptr + 0x141) = 0;
  *(undefined8 *)((long)ptr + 0x130) = 0;
  *(undefined8 *)((long)ptr + 0x138) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }